

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow *window,ImGuiViewportP *viewport)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiViewportP *pIVar4;
  ImGuiWindow *pIVar5;
  ImGuiViewportP *pIVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  
  pIVar7 = GImGui;
  pIVar4 = window->Viewport;
  if ((pIVar4 != viewport) && (((viewport->super_ImGuiViewport).Flags & 0x1400U) == 0x1000)) {
    fVar12 = (viewport->super_ImGuiViewport).Pos.x;
    fVar1 = (window->Pos).x;
    if (fVar1 < fVar12) {
      return false;
    }
    fVar2 = (viewport->super_ImGuiViewport).Pos.y;
    fVar3 = (window->Pos).y;
    if (fVar3 < fVar2) {
      return false;
    }
    fVar13 = (window->Size).x + fVar1;
    if (fVar12 + (viewport->super_ImGuiViewport).Size.x < fVar13) {
      return false;
    }
    fVar12 = (window->Size).y + fVar3;
    if (fVar2 + (viewport->super_ImGuiViewport).Size.y < fVar12) {
      return false;
    }
    bVar8 = GetWindowAlwaysWantOwnViewport(window);
    if (!bVar8) {
      lVar9 = (long)(pIVar7->Windows).Size;
      if (lVar9 < 1) {
        bVar8 = true;
      }
      else {
        lVar10 = 0;
        do {
          pIVar5 = (pIVar7->Windows).Data[lVar10];
          if (pIVar5 == window) {
            iVar11 = 2;
            bVar8 = false;
          }
          else {
            if (((pIVar5->WasActive == true) && (pIVar5->ViewportOwned == true)) &&
               ((pIVar5->Flags & 0x1000000) == 0)) {
              pIVar6 = pIVar5->Viewport;
              fVar2 = (pIVar6->super_ImGuiViewport).Pos.y;
              if (((fVar3 < (pIVar6->super_ImGuiViewport).Size.y + fVar2) && (fVar2 < fVar12)) &&
                 ((fVar2 = (pIVar6->super_ImGuiViewport).Pos.x,
                  fVar1 < (pIVar6->super_ImGuiViewport).Size.x + fVar2 && (fVar2 < fVar13)))) {
                bVar8 = false;
                iVar11 = 1;
                goto LAB_00151eab;
              }
            }
            iVar11 = 0;
            bVar8 = true;
          }
LAB_00151eab:
          if (!bVar8) goto LAB_00151ebd;
          lVar10 = lVar10 + 1;
        } while (lVar9 != lVar10);
        iVar11 = 2;
LAB_00151ebd:
        bVar8 = iVar11 == 2;
      }
      if (bVar8) {
        if ((window->ViewportOwned == true) && (0 < (pIVar7->Windows).Size)) {
          lVar9 = 0;
          do {
            pIVar5 = (pIVar7->Windows).Data[lVar9];
            pIVar6 = pIVar5->Viewport;
            if (pIVar6 == pIVar4) {
              if ((pIVar5->ViewportOwned == true) && (pIVar6->Window == pIVar5)) {
                (pIVar6->super_ImGuiViewport).Size.x = 0.0;
                (pIVar6->super_ImGuiViewport).Size.y = 0.0;
              }
              pIVar5->Viewport = viewport;
              pIVar5->ViewportId = (viewport->super_ImGuiViewport).ID;
              pIVar5->ViewportOwned = viewport->Window == pIVar5;
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < (pIVar7->Windows).Size);
        }
        if ((window->ViewportOwned == true) && (pIVar4 = window->Viewport, pIVar4->Window == window)
           ) {
          (pIVar4->super_ImGuiViewport).Size.x = 0.0;
          (pIVar4->super_ImGuiViewport).Size.y = 0.0;
        }
        window->Viewport = viewport;
        window->ViewportId = (viewport->super_ImGuiViewport).ID;
        window->ViewportOwned = viewport->Window == window;
        BringWindowToDisplayFront(window);
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow* window, ImGuiViewportP* viewport)
{
    ImGuiContext& g = *GImGui;
    if (window->Viewport == viewport)
        return false;
    if ((viewport->Flags & ImGuiViewportFlags_CanHostOtherWindows) == 0)
        return false;
    if ((viewport->Flags & ImGuiViewportFlags_Minimized) != 0)
        return false;
    if (!viewport->GetMainRect().Contains(window->Rect()))
        return false;
    if (GetWindowAlwaysWantOwnViewport(window))
        return false;

    // FIXME: Can't use g.WindowsFocusOrder[] for root windows only as we care about Z order. If we maintained a DisplayOrder along with FocusOrder we could..
    for (int n = 0; n < g.Windows.Size; n++)
    {
        ImGuiWindow* window_behind = g.Windows[n];
        if (window_behind == window)
            break;
        if (window_behind->WasActive && window_behind->ViewportOwned && !(window_behind->Flags & ImGuiWindowFlags_ChildWindow))
            if (window_behind->Viewport->GetMainRect().Overlaps(window->Rect()))
                return false;
    }

    // Move to the existing viewport, Move child/hosted windows as well (FIXME-OPT: iterate child)
    ImGuiViewportP* old_viewport = window->Viewport;
    if (window->ViewportOwned)
        for (int n = 0; n < g.Windows.Size; n++)
            if (g.Windows[n]->Viewport == old_viewport)
                SetWindowViewport(g.Windows[n], viewport);
    SetWindowViewport(window, viewport);
    BringWindowToDisplayFront(window);

    return true;
}